

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPif(TPpContext *this,TPpToken *ppToken)

{
  bool local_29;
  int local_28;
  int iStack_24;
  bool err;
  int res;
  int token;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  _res = ppToken;
  ppToken_local = (TPpToken *)this;
  iStack_24 = scanToken(this,ppToken);
  if ((this->ifdepth < 0x41) && (this->elsetracker < 0x41)) {
    this->elsetracker = this->elsetracker + 1;
    this->ifdepth = this->ifdepth + 1;
    local_28 = 0;
    local_29 = false;
    iStack_24 = eval(this,iStack_24,0,false,&local_28,&local_29,_res);
    iStack_24 = extraTokenCheck(this,0xa5,_res,iStack_24);
    if ((local_28 == 0) && ((local_29 & 1U) == 0)) {
      iStack_24 = CPPelse(this,1,_res);
    }
    this_local._4_4_ = iStack_24;
  }
  else {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,_res,"maximum nesting depth exceeded","#if","");
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::CPPif(TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (ifdepth >= maxIfNesting || elsetracker >= maxIfNesting) {
        parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#if", "");
        return EndOfInput;
    } else {
        elsetracker++;
        ifdepth++;
    }
    int res = 0;
    bool err = false;
    token = eval(token, MIN_PRECEDENCE, false, res, err, ppToken);
    token = extraTokenCheck(PpAtomIf, ppToken, token);
    if (!res && !err)
        token = CPPelse(1, ppToken);

    return token;
}